

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall
wasm::ThreadPool::work
          (ThreadPool *this,
          vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
          *doWorkers)

{
  ThreadWorkState TVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  reference this_00;
  pointer this_01;
  function<wasm::ThreadWorkState_()> local_70;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  lock_guard<std::mutex> poolLock;
  size_t num;
  vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
  *doWorkers_local;
  ThreadPool *this_local;
  
  sVar2 = std::
          vector<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
          ::size(&this->threads);
  if (sVar2 == 0) {
    sVar2 = std::
            vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
            ::size(doWorkers);
    if (sVar2 == 0) {
      __assert_fail("doWorkers.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xb1,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    do {
      pvVar3 = std::
               vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
               ::operator[](doWorkers,0);
      TVar1 = std::function<wasm::ThreadWorkState_()>::operator()(pvVar3);
    } while (TVar1 == More);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&lock._M_owns,(mutex_type *)workMutex);
    sVar4 = std::
            vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
            ::size(doWorkers);
    if (sVar4 != sVar2) {
      __assert_fail("doWorkers.size() == num",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbc,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    if (((this->running ^ 0xffU) & 1) == 0) {
      __assert_fail("!running",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                    ,0xbd,
                    "void wasm::ThreadPool::work(std::vector<std::function<ThreadWorkState ()>> &)")
      ;
    }
    this->running = true;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_38,(mutex_type *)threadMutex);
    resetThreadsAreReady(this);
    for (local_50 = 0; local_50 < sVar2; local_50 = local_50 + 1) {
      this_00 = std::
                vector<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                ::operator[](&this->threads,local_50);
      this_01 = std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>::operator->
                          (this_00);
      pvVar3 = std::
               vector<std::function<wasm::ThreadWorkState_()>,_std::allocator<std::function<wasm::ThreadWorkState_()>_>_>
               ::operator[](doWorkers,local_50);
      std::function<wasm::ThreadWorkState_()>::function(&local_70,pvVar3);
      Thread::work(this_01,&local_70);
      std::function<wasm::ThreadWorkState_()>::~function(&local_70);
    }
    std::condition_variable::
    wait<wasm::ThreadPool::work(std::vector<std::function<wasm::ThreadWorkState()>,std::allocator<std::function<wasm::ThreadWorkState()>>>&)::__0>
              (&this->condition,(unique_lock<std::mutex> *)local_38,(anon_class_8_1_8991fb9c)this);
    this->running = false;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&lock._M_owns);
  }
  return;
}

Assistant:

void ThreadPool::work(
  std::vector<std::function<ThreadWorkState()>>& doWorkers) {
  size_t num = threads.size();
  // If no multiple cores, or on a side thread, do not use worker threads
  if (num == 0) {
    // just run sequentially
    DEBUG_POOL("work() sequentially\n");
    assert(doWorkers.size() > 0);
    while (doWorkers[0]() == ThreadWorkState::More) {
    }
    return;
  }
  // run in parallel on threads
  // TODO: fancy work stealing
  DEBUG_POOL("work() on threads\n");
  // lock globally on doing work in the pool - the threadPool can only be used
  // from one thread at a time, all others must wait patiently
  std::lock_guard<std::mutex> poolLock(workMutex);
  assert(doWorkers.size() == num);
  assert(!running);
  DEBUG_POOL("running = true\n");
  running = true;
  std::unique_lock<std::mutex> lock(threadMutex);
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    threads[i]->work(doWorkers[i]);
  }
  DEBUG_POOL("main thread waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("main thread done waiting\n");
  DEBUG_POOL("running = false\n");
  running = false;
  DEBUG_POOL("work() is done\n");
}